

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O0

void __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::binary_search_tree_kernel_2
          (binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this)

{
  node *this_00;
  enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>_>_>
  *in_RDI;
  memory_manager_stateless_kernel_1<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node>
  *in_stack_ffffffffffffffd0;
  
  enumerable<dlib::map_pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>_>_>
  ::enumerable(in_RDI);
  asc_pair_remover<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::asc_pair_remover((asc_pair_remover<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffffd0);
  in_RDI->_vptr_enumerable = (_func_int **)&PTR__binary_search_tree_kernel_2_00556660;
  in_RDI[1]._vptr_enumerable = (_func_int **)&PTR__binary_search_tree_kernel_2_005566c0;
  memory_manager_stateless_kernel_1<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node>
  ::memory_manager_stateless_kernel_1
            ((memory_manager_stateless_kernel_1<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node>
              *)(in_RDI + 2));
  this_00 = memory_manager_stateless_kernel_1<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node>
            ::allocate(in_stack_ffffffffffffffd0);
  in_RDI[3]._vptr_enumerable = (_func_int **)this_00;
  in_RDI[4]._vptr_enumerable = (_func_int **)0x0;
  in_RDI[5]._vptr_enumerable = in_RDI[3]._vptr_enumerable;
  in_RDI[6]._vptr_enumerable = (_func_int **)0x0;
  *(undefined1 *)&in_RDI[7]._vptr_enumerable = 1;
  mpair::mpair((mpair *)this_00);
  *(undefined1 *)(in_RDI[3]._vptr_enumerable + 8) = 1;
  *in_RDI[3]._vptr_enumerable = (_func_int *)0x0;
  in_RDI[3]._vptr_enumerable[1] = (_func_int *)0x0;
  in_RDI[3]._vptr_enumerable[2] = (_func_int *)0x0;
  return;
}

Assistant:

binary_search_tree_kernel_2(
            ) :
                NIL(pool.allocate()),
                tree_size(0),
                tree_root(NIL),
                current_element(0),
                at_start_(true)
            {
                NIL->color = black;
                NIL->left = 0;
                NIL->right = 0;
                NIL->parent = 0;
            }